

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall protozero::Field::get(Field *this,string *val)

{
  string local_30;
  
  as_std_string_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=((string *)val,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void get(std::string* val) const { *val = as_std_string(); }